

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

CBString * __thiscall
Bstrlib::CBString::midstr(CBString *__return_storage_ptr__,CBString *this,int left,int len)

{
  uint uVar1;
  int iVar2;
  tagbstring t;
  tagbstring local_18;
  
  uVar1 = 0;
  if (0 < left) {
    uVar1 = left;
  }
  iVar2 = 0;
  if (left < 0) {
    iVar2 = left;
  }
  local_18.slen = (this->super_tagbstring).slen - uVar1;
  if (iVar2 + len < local_18.slen) {
    local_18.slen = iVar2 + len;
  }
  if (local_18.slen < 1) {
    CBString(__return_storage_ptr__,anon_var_dwarf_2ab63 + 0x10);
  }
  else {
    local_18.data = (this->super_tagbstring).data + uVar1;
    local_18.mlen = -1;
    CBString(__return_storage_ptr__,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

CBString CBString::midstr (int left, int len) const {
struct tagbstring t;
	if (left < 0) {
		len += left;
		left = 0;
	}
	if (len > slen - left) len = slen - left;
	if (len <= 0) return CBString ("");
	blk2tbstr (t, data + left, len);
	return CBString (t);
}